

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_buffer_block(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  bool bVar2;
  SPIRType *pSVar3;
  size_type sVar4;
  uint32_t local_1c;
  
  pSVar3 = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  if (var->storage == StorageClassUniform) {
    bVar1 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(pSVar3->super_IVariant).self.id,Block);
  }
  else {
    bVar1 = false;
  }
  local_1c = (var->super_IVariant).self.id;
  sVar4 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->flattened_buffer_blocks)._M_h,&local_1c);
  if (sVar4 == 0) {
    bVar2 = is_legacy(this);
    if (((bVar2) || (((this->options).es == false && ((this->options).version == 0x82)))) ||
       ((bVar1 != false && ((this->options).emit_uniform_buffer_as_plain_uniforms == true)))) {
      emit_buffer_block_legacy(this,var);
    }
    else {
      emit_buffer_block_native(this,var);
    }
  }
  else {
    emit_buffer_block_flattened(this,var);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	bool ubo_block = var.storage == StorageClassUniform && has_decoration(type.self, DecorationBlock);

	if (flattened_buffer_blocks.count(var.self))
		emit_buffer_block_flattened(var);
	else if (is_legacy() || (!options.es && options.version == 130) ||
	         (ubo_block && options.emit_uniform_buffer_as_plain_uniforms))
		emit_buffer_block_legacy(var);
	else
		emit_buffer_block_native(var);
}